

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int CheckFromArray(void)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char local_128 [8];
  char buf2 [128];
  char buf1 [128];
  char *local_20;
  char *fact;
  FILE *out;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
    goto LAB_00103677;
  }
  memset(buf2 + 0x78,0,0x80);
  local_20 = ScanChars((FILE *)__stream,0x80,buf2 + 0x78);
  if (local_20 == "PASSED") {
    pcVar1 = testInOut[testN].out1;
    sVar3 = strlen(testInOut[testN].out1);
    iVar2 = strncasecmp(pcVar1,buf2 + 0x78,sVar3);
    if (iVar2 != 0) {
      local_20 = "FAILED";
    }
  }
  if ((local_20 == "PASSED") && (testInOut[testN].out2 != (char *)0x0)) {
    memset(local_128,0,0x80);
    local_20 = ScanChars((FILE *)__stream,0x80,local_128);
    if (local_20 == "PASSED") {
      pcVar1 = testInOut[testN].out2;
      sVar3 = strlen(testInOut[testN].out2);
      iVar2 = strncasecmp(pcVar1,local_128,sVar3);
      if (iVar2 != 0) {
        if (testInOut[testN].out20 != (char *)0x0) {
          pcVar1 = testInOut[testN].out20;
          sVar3 = strlen(testInOut[testN].out20);
          iVar2 = strncasecmp(pcVar1,local_128,sVar3);
          if (iVar2 == 0) goto LAB_00103611;
        }
        printf("wrong output -- ");
        local_20 = "FAILED";
      }
    }
  }
LAB_00103611:
  if ((local_20 == "PASSED") && (iVar2 = HaveGarbageAtTheEnd((FILE *)__stream), iVar2 != 0)) {
    local_20 = "FAILED";
  }
  fclose(__stream);
  printf("%s\n",local_20);
  out._4_4_ = (uint)(local_20 == "FAILED");
LAB_00103677:
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    const char* fact = Pass;
    char buf1[128] = {0};
    fact = ScanChars(out, sizeof(buf1), buf1);
    if (fact == Pass && _strnicmp(testInOut[testN].out1, buf1, strlen(testInOut[testN].out1)) != 0) {
        fact = Fail;
    }
    if (fact == Pass && testInOut[testN].out2 != NULL) { // check path
        char buf2[128] = {0};
        fact = ScanChars(out, sizeof(buf2), buf2);
        if (fact == Pass && _strnicmp(testInOut[testN].out2, buf2, strlen(testInOut[testN].out2)) != 0) {
            if (testInOut[testN].out20 == NULL || _strnicmp(testInOut[testN].out20, buf2, strlen(testInOut[testN].out20)) != 0) {
                printf("wrong output -- ");
                fact = Fail;
            }
        }
    }
    if (fact == Pass && HaveGarbageAtTheEnd(out)) {
        fact = Fail;
    }
    fclose(out);
    printf("%s\n", fact);
    testN++;
    return fact == Fail;
}